

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetMinStep(void *ida_mem,sunrealtype hmin)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x14b;
  }
  else {
    if (0.0 <= hmin) {
      if ((hmin != 0.0) || (NAN(hmin))) {
        *(sunrealtype *)((long)ida_mem + 800) = hmin;
      }
      else {
        *(undefined8 *)((long)ida_mem + 800) = 0;
      }
      return 0;
    }
    msgfmt = "hmin < 0 illegal.";
    error_code = -0x16;
    line = 0x153;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetMinStep",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetMinStep(void* ida_mem, sunrealtype hmin)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (hmin < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NEG_HMIN);
    return (IDA_ILL_INPUT);
  }

  /* Passing 0 sets hmin = zero */
  if (hmin == ZERO)
  {
    IDA_mem->ida_hmin = HMIN_DEFAULT;
    return (IDA_SUCCESS);
  }

  IDA_mem->ida_hmin = hmin;

  return (IDA_SUCCESS);
}